

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O3

bool leveldb::CompareIterators(int step,DB *model,DB *db,Snapshot *model_snap,Snapshot *db_snap)

{
  FILE *pFVar1;
  _Alloc_hider _Var2;
  _Alloc_hider _Var3;
  char cVar4;
  char cVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  undefined4 extraout_var;
  long *plVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  uint uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 local_d0 [16];
  string local_c0;
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  string local_80;
  undefined1 local_60 [16];
  char local_50 [16];
  undefined2 local_40 [4];
  Snapshot *local_38;
  long *plVar9;
  undefined4 extraout_var_00;
  
  local_40[0] = 0x100;
  local_38 = model_snap;
  iVar8 = (*model->_vptr_DB[6])(model,local_40);
  plVar9 = (long *)CONCAT44(extraout_var,iVar8);
  local_38 = db_snap;
  iVar8 = (*db->_vptr_DB[6])(db,local_40);
  plVar10 = (long *)CONCAT44(extraout_var_00,iVar8);
  (**(code **)(*plVar9 + 0x18))(plVar9);
  (**(code **)(*plVar10 + 0x18))(plVar10);
  bVar14 = true;
  uVar15 = 1;
  do {
    cVar4 = (**(code **)(*plVar9 + 0x10))(plVar9);
    if (cVar4 == '\0') break;
    cVar4 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (cVar4 == '\0') break;
    auVar16 = (**(code **)(*plVar9 + 0x40))(plVar9);
    uVar11 = auVar16._8_8_;
    auVar17 = (**(code **)(*plVar10 + 0x40))(plVar10);
    uVar12 = auVar17._8_8_;
    uVar13 = uVar12;
    if (uVar11 < uVar12) {
      uVar13 = uVar11;
    }
    iVar8 = bcmp(auVar16._0_8_,auVar17._0_8_,uVar13);
    pFVar1 = _stderr;
    if ((iVar8 != 0) || (uVar11 != uVar12)) {
      local_60 = (**(code **)(*plVar9 + 0x40))(plVar9);
      EscapeString_abi_cxx11_(&local_c0,(leveldb *)local_60,local_60._8_8_);
      _Var2._M_p = local_c0._M_dataplus._M_p;
      auVar16 = (**(code **)(*plVar10 + 0x40))(plVar10);
      local_d0 = auVar16;
      EscapeString_abi_cxx11_(&local_80,(leveldb *)local_d0,auVar16._8_8_);
      fprintf(pFVar1,"step %d: Key mismatch: \'%s\' vs. \'%s\'\n",(ulong)(uint)step,_Var2._M_p,
              local_80._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      bVar14 = false;
      goto LAB_0010d7c8;
    }
    auVar16 = (**(code **)(*plVar9 + 0x48))(plVar9);
    uVar11 = auVar16._8_8_;
    auVar17 = (**(code **)(*plVar10 + 0x48))(plVar10);
    uVar12 = auVar17._8_8_;
    uVar13 = uVar12;
    if (uVar11 < uVar12) {
      uVar13 = uVar11;
    }
    iVar8 = bcmp(auVar16._0_8_,auVar17._0_8_,uVar13);
    pFVar1 = _stderr;
    if ((iVar8 != 0) || (uVar11 != uVar12)) {
      auVar16 = (**(code **)(*plVar9 + 0x40))(plVar9);
      local_d0 = auVar16;
      EscapeString_abi_cxx11_(&local_c0,(leveldb *)local_d0,auVar16._8_8_);
      _Var2._M_p = local_c0._M_dataplus._M_p;
      auVar16 = (**(code **)(*plVar9 + 0x48))(plVar9);
      local_90 = auVar16;
      EscapeString_abi_cxx11_(&local_80,(leveldb *)local_90,auVar16._8_8_);
      _Var3._M_p = local_80._M_dataplus._M_p;
      auVar16 = (**(code **)(*plVar9 + 0x48))(plVar9);
      local_a0 = auVar16;
      EscapeString_abi_cxx11_((string *)local_60,(leveldb *)local_a0,auVar16._8_8_);
      fprintf(pFVar1,"step %d: Value mismatch for key \'%s\': \'%s\' vs. \'%s\'\n",(ulong)(uint)step
              ,_Var2._M_p,_Var3._M_p,local_60._0_8_);
      if ((char *)local_60._0_8_ != local_50) {
        operator_delete((void *)local_60._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      bVar14 = false;
    }
    (**(code **)(*plVar9 + 0x30))(plVar9);
    (**(code **)(*plVar10 + 0x30))(plVar10);
    uVar15 = uVar15 + 1;
  } while (bVar14);
  uVar15 = uVar15 - 1;
  if (bVar14 != false) {
    cVar4 = (**(code **)(*plVar9 + 0x10))(plVar9);
    cVar5 = (**(code **)(*plVar10 + 0x10))(plVar10);
    pFVar1 = _stderr;
    if (cVar4 != cVar5) {
      bVar6 = (**(code **)(*plVar9 + 0x10))(plVar9);
      bVar7 = (**(code **)(*plVar10 + 0x10))(plVar10);
      bVar14 = false;
      fprintf(pFVar1,"step %d: Mismatch at end of iterators: %d vs. %d\n",(ulong)(uint)step,
              (ulong)bVar6,(ulong)bVar7);
    }
  }
LAB_0010d7c8:
  fprintf(_stderr,"%d entries compared: ok=%d\n",(ulong)uVar15,(ulong)bVar14);
  (**(code **)(*plVar9 + 8))(plVar9);
  (**(code **)(*plVar10 + 8))(plVar10);
  return bVar14;
}

Assistant:

static bool CompareIterators(int step, DB* model, DB* db,
                             const Snapshot* model_snap,
                             const Snapshot* db_snap) {
  ReadOptions options;
  options.snapshot = model_snap;
  Iterator* miter = model->NewIterator(options);
  options.snapshot = db_snap;
  Iterator* dbiter = db->NewIterator(options);
  bool ok = true;
  int count = 0;
  for (miter->SeekToFirst(), dbiter->SeekToFirst();
       ok && miter->Valid() && dbiter->Valid(); miter->Next(), dbiter->Next()) {
    count++;
    if (miter->key().compare(dbiter->key()) != 0) {
      std::fprintf(stderr, "step %d: Key mismatch: '%s' vs. '%s'\n", step,
                   EscapeString(miter->key()).c_str(),
                   EscapeString(dbiter->key()).c_str());
      ok = false;
      break;
    }

    if (miter->value().compare(dbiter->value()) != 0) {
      std::fprintf(stderr,
                   "step %d: Value mismatch for key '%s': '%s' vs. '%s'\n",
                   step, EscapeString(miter->key()).c_str(),
                   EscapeString(miter->value()).c_str(),
                   EscapeString(miter->value()).c_str());
      ok = false;
    }
  }

  if (ok) {
    if (miter->Valid() != dbiter->Valid()) {
      std::fprintf(stderr, "step %d: Mismatch at end of iterators: %d vs. %d\n",
                   step, miter->Valid(), dbiter->Valid());
      ok = false;
    }
  }
  std::fprintf(stderr, "%d entries compared: ok=%d\n", count, ok);
  delete miter;
  delete dbiter;
  return ok;
}